

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O0

void __thiscall Stack::Stack(Stack *this)

{
  Stack *this_local;
  
  JsonProtocol::JsonProtocol(&this->super_JsonProtocol);
  (this->super_JsonProtocol)._vptr_JsonProtocol = (_func_int **)&PTR__Stack_00266c80;
  std::__cxx11::string::string((string *)&this->file);
  std::__cxx11::string::string((string *)&this->functionName);
  this->level = 0;
  this->line = 0;
  std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::vector(&this->localVariables);
  std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::vector(&this->upvalueVariables);
  std::make_shared<Arena<Variable>>();
  return;
}

Assistant:

Stack::Stack()
	: level(0), line(0), variableArena(std::make_shared<Arena<Variable>>()) {
}